

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<const_void_*const_&> __thiscall
kj::Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>>::find<0ul,void_const*&>
          (Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>> *this,Entry *params)

{
  Entry *pEVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<const_void_*const> AVar3;
  unsigned_long *pos;
  Entry *local_50;
  Entry *local_48;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos597;
  Entry *params_local;
  Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
  *this_local;
  
  _pos597.field_1 = in_RDX;
  pEVar1 = (Entry *)get<0ul,kj::HashIndex<kj::_::HashSetCallbacks>const&>
                              ((HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
                                *)&(params->value).dir.ptr);
  AVar3 = Vector<const_void_*>::asPtr((Vector<const_void_*> *)params);
  fwd<void_const*&>((Entry *)_pos597.field_1);
  local_50 = AVar3.ptr;
  local_48 = (Entry *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = pEVar1;
  HashIndex<kj::_::HashSetCallbacks>::find<void_const*const,void_const*&>
            ((HashIndex<kj::_::HashSetCallbacks> *)local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<const_void_*const_&>::Maybe((Maybe<const_void_*const_&> *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    pEVar1 = Vector<const_void_*>::operator[]((Vector<const_void_*> *)params,*puVar2);
    Maybe<const_void_*const_&>::Maybe((Maybe<const_void_*const_&> *)this,pEVar1);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<const_void_*const_&>)(Entry *)this;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}